

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NNValidatorTests.cpp
# Opt level: O3

int testInvalidUpsampleNearestNeighborsModeWithAlignCorners(void)

{
  RepeatedField<long> *this;
  bool bVar1;
  int iVar2;
  ModelDescription *pMVar3;
  Type *pTVar4;
  FeatureType *pFVar5;
  ArrayFeatureType *pAVar6;
  TypeUnion this_00;
  Type *this_01;
  LayerUnion this_02;
  ostream *poVar7;
  Rep *pRVar8;
  int iVar9;
  int iVar10;
  Result res;
  Model m1;
  undefined1 local_a0 [8];
  _Alloc_hider local_98;
  undefined1 local_90 [24];
  Model local_78;
  pointer local_48;
  _Alloc_hider local_40;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_30;
  
  CoreML::Specification::Model::Model(&local_78);
  if (local_78.description_ == (ModelDescription *)0x0) {
    pMVar3 = (ModelDescription *)operator_new(0x78);
    CoreML::Specification::ModelDescription::ModelDescription(pMVar3);
    local_78.description_ = pMVar3;
  }
  pTVar4 = google::protobuf::internal::RepeatedPtrFieldBase::
           Add<google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::TypeHandler>
                     (&((local_78.description_)->input_).super_RepeatedPtrFieldBase,(Type *)0x0);
  local_a0 = (undefined1  [8])local_90;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_a0,"input","");
  google::protobuf::internal::ArenaStringPtr::SetNoArena
            (&pTVar4->name_,
             (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_,
             (string *)local_a0);
  if (local_a0 != (undefined1  [8])local_90) {
    operator_delete((void *)local_a0,local_90._0_8_ + 1);
  }
  pFVar5 = pTVar4->type_;
  if (pFVar5 == (FeatureType *)0x0) {
    pFVar5 = (FeatureType *)operator_new(0x28);
    CoreML::Specification::FeatureType::FeatureType(pFVar5);
    pTVar4->type_ = pFVar5;
  }
  if (pFVar5->_oneof_case_[0] == 5) {
    pAVar6 = (pFVar5->Type_).multiarraytype_;
  }
  else {
    CoreML::Specification::FeatureType::clear_Type(pFVar5);
    pFVar5->_oneof_case_[0] = 5;
    pAVar6 = (ArrayFeatureType *)operator_new(0x48);
    CoreML::Specification::ArrayFeatureType::ArrayFeatureType(pAVar6);
    (pFVar5->Type_).multiarraytype_ = pAVar6;
  }
  this = &pAVar6->shape_;
  iVar10 = (pAVar6->shape_).current_size_;
  iVar9 = (pAVar6->shape_).total_size_;
  if (iVar10 == iVar9) {
    google::protobuf::RepeatedField<long>::Reserve(this,iVar10 + 1);
    iVar10 = (pAVar6->shape_).current_size_;
    iVar9 = (pAVar6->shape_).total_size_;
  }
  pRVar8 = (pAVar6->shape_).rep_;
  iVar2 = iVar10 + 1;
  (pAVar6->shape_).current_size_ = iVar2;
  pRVar8->elements[iVar10] = 5;
  if (iVar2 == iVar9) {
    google::protobuf::RepeatedField<long>::Reserve(this,iVar10 + 2);
    iVar2 = (pAVar6->shape_).current_size_;
    iVar9 = (pAVar6->shape_).total_size_;
    pRVar8 = (pAVar6->shape_).rep_;
  }
  iVar10 = iVar2 + 1;
  this->current_size_ = iVar10;
  pRVar8->elements[iVar2] = 5;
  if (iVar10 == iVar9) {
    google::protobuf::RepeatedField<long>::Reserve(this,iVar2 + 2);
    iVar10 = (pAVar6->shape_).current_size_;
    pRVar8 = (pAVar6->shape_).rep_;
  }
  this->current_size_ = iVar10 + 1;
  pRVar8->elements[iVar10] = 5;
  if (local_78.description_ == (ModelDescription *)0x0) {
    pMVar3 = (ModelDescription *)operator_new(0x78);
    CoreML::Specification::ModelDescription::ModelDescription(pMVar3);
    local_78.description_ = pMVar3;
  }
  pTVar4 = google::protobuf::internal::RepeatedPtrFieldBase::
           Add<google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::TypeHandler>
                     (&((local_78.description_)->output_).super_RepeatedPtrFieldBase,(Type *)0x0);
  local_a0 = (undefined1  [8])local_90;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_a0,"probs","");
  google::protobuf::internal::ArenaStringPtr::SetNoArena
            (&pTVar4->name_,
             (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_,
             (string *)local_a0);
  if (local_a0 != (undefined1  [8])local_90) {
    operator_delete((void *)local_a0,local_90._0_8_ + 1);
  }
  pFVar5 = pTVar4->type_;
  if (pFVar5 == (FeatureType *)0x0) {
    pFVar5 = (FeatureType *)operator_new(0x28);
    CoreML::Specification::FeatureType::FeatureType(pFVar5);
    pTVar4->type_ = pFVar5;
  }
  if (pFVar5->_oneof_case_[0] != 5) {
    CoreML::Specification::FeatureType::clear_Type(pFVar5);
    pFVar5->_oneof_case_[0] = 5;
    pAVar6 = (ArrayFeatureType *)operator_new(0x48);
    CoreML::Specification::ArrayFeatureType::ArrayFeatureType(pAVar6);
    (pFVar5->Type_).multiarraytype_ = pAVar6;
  }
  if (local_78._oneof_case_[0] != 500) {
    CoreML::Specification::Model::clear_Type(&local_78);
    local_78._oneof_case_[0] = 500;
    this_00.pipelineclassifier_ = (PipelineClassifier *)operator_new(0x58);
    CoreML::Specification::NeuralNetwork::NeuralNetwork(this_00.neuralnetwork_);
    local_78.Type_.pipelineclassifier_ = this_00.pipelineclassifier_;
  }
  (local_78.Type_.neuralnetworkregressor_)->arrayinputshapemapping_ = 1;
  this_01 = google::protobuf::internal::RepeatedPtrFieldBase::
            Add<google::protobuf::RepeatedPtrField<CoreML::Specification::NeuralNetworkLayer>::TypeHandler>
                      ((RepeatedPtrFieldBase *)&(local_78.Type_.pipeline_)->models_,(Type *)0x0);
  CoreML::Specification::NeuralNetworkLayer::add_input(this_01,"input");
  CoreML::Specification::NeuralNetworkLayer::add_output(this_01,"probs");
  if (this_01->_oneof_case_[0] == 0xd2) {
    this_02 = this_01->layer_;
  }
  else {
    CoreML::Specification::NeuralNetworkLayer::clear_layer(this_01);
    this_01->_oneof_case_[0] = 0xd2;
    this_02.convolution_ = (ConvolutionLayerParams *)operator_new(0x48);
    CoreML::Specification::UpsampleLayerParams::UpsampleLayerParams(this_02.upsample_);
    (this_01->layer_).upsample_ = (UpsampleLayerParams *)this_02;
  }
  *(undefined8 *)((long)&(this_02.simplerecurrent_)->outputvectorsize_ + 4) = 0x200000000;
  CoreML::validate<(MLModelType)500>((Result *)local_a0,&local_78);
  bVar1 = CoreML::Result::good((Result *)local_a0);
  if (bVar1) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/tests/NNValidatorTests.cpp"
               ,0x6c);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
    poVar7 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0xbe4);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,": error: ",9);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"!((res).good())",0xf);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7," was false, expected true.",0x1a);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
  }
  else {
    *(undefined8 *)((long)&(this_02.simplerecurrent_)->outputvectorsize_ + 4) = 0x100000000;
    CoreML::validate<(MLModelType)500>((Result *)&local_48,&local_78);
    local_a0 = (undefined1  [8])local_48;
    std::__cxx11::string::operator=((string *)&local_98,(string *)&local_40);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_p != &local_30) {
      operator_delete(local_40._M_p,local_30._M_allocated_capacity + 1);
    }
    bVar1 = CoreML::Result::good((Result *)local_a0);
    iVar10 = 0;
    if (!bVar1) goto LAB_0016e586;
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/tests/NNValidatorTests.cpp"
               ,0x6c);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
    poVar7 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0xbea);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,": error: ",9);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"!((res).good())",0xf);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7," was false, expected true.",0x1a);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
  }
  std::ostream::put((char)poVar7);
  iVar10 = 1;
  std::ostream::flush();
LAB_0016e586:
  if (local_98._M_p != local_90 + 8) {
    operator_delete(local_98._M_p,local_90._8_8_ + 1);
  }
  CoreML::Specification::Model::~Model(&local_78);
  return iVar10;
}

Assistant:

int testInvalidUpsampleNearestNeighborsModeWithAlignCorners() {

    Specification::Model m1;

    auto *topIn = m1.mutable_description()->add_input();
    topIn->set_name("input");
    auto *shape = topIn->mutable_type()->mutable_multiarraytype();
    shape->add_shape(5);
    shape->add_shape(5);
    shape->add_shape(5);

    auto *out3 = m1.mutable_description()->add_output();
    out3->set_name("probs");
    out3->mutable_type()->mutable_multiarraytype();

    const auto nn = m1.mutable_neuralnetwork();
    nn->set_arrayinputshapemapping(Specification::NeuralNetworkMultiArrayShapeMapping::EXACT_ARRAY_MAPPING);

    Specification::NeuralNetworkLayer *upsampleLayer = nn->add_layers();
    upsampleLayer->add_input("input");
    upsampleLayer->add_output("probs");
    auto *params = upsampleLayer->mutable_upsample();

    params->set_mode(Specification::UpsampleLayerParams_InterpolationMode::UpsampleLayerParams_InterpolationMode_NN);
    params->set_linearupsamplemode(Specification::UpsampleLayerParams_LinearUpsampleMode_ALIGN_CORNERS_FALSE);
    
    Result res = validate<MLModelType_neuralNetwork>(m1);
    ML_ASSERT_BAD(res);

    params->set_mode(Specification::UpsampleLayerParams_InterpolationMode::UpsampleLayerParams_InterpolationMode_NN);
    params->set_linearupsamplemode(Specification::UpsampleLayerParams_LinearUpsampleMode_ALIGN_CORNERS_TRUE);
    
    res = validate<MLModelType_neuralNetwork>(m1);
    ML_ASSERT_BAD(res);
    return 0;
}